

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<int,int>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,3,0>
       ::run<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                 (redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *eval,scalar_sum_op<int,_int> *func,
                 Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *xpr)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  Index IVar9;
  long lVar10;
  Index index;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  lVar5 = (xpr->
          super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ).m_rows.m_value;
  IVar9 = first_aligned_impl<16,_Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run(xpr);
  lVar11 = lVar5 - IVar9;
  lVar10 = lVar11 / 8;
  piVar6 = (eval->
           super_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
           ).
           super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar11 + 3U < 7) {
    iVar8 = *piVar6;
    for (lVar10 = 1; lVar10 < lVar5; lVar10 = lVar10 + 1) {
      iVar8 = iVar8 + piVar6[lVar10];
    }
  }
  else {
    piVar1 = piVar6 + IVar9;
    iVar8 = *piVar1;
    iVar13 = piVar1[1];
    iVar14 = piVar1[2];
    iVar15 = piVar1[3];
    if (7 < lVar11) {
      lVar3 = (lVar11 / 4) * 4;
      lVar2 = IVar9 + lVar10 * 8;
      piVar1 = piVar6 + IVar9 + 4;
      iVar16 = *piVar1;
      iVar17 = piVar1[1];
      iVar18 = piVar1[2];
      iVar19 = piVar1[3];
      lVar7 = IVar9;
      while (lVar12 = lVar7 + 8, lVar12 < lVar2) {
        piVar1 = piVar6 + lVar12;
        piVar4 = piVar6 + lVar7 + 0xc;
        iVar8 = iVar8 + *piVar1;
        iVar13 = iVar13 + piVar1[1];
        iVar14 = iVar14 + piVar1[2];
        iVar15 = iVar15 + piVar1[3];
        iVar16 = iVar16 + *piVar4;
        iVar17 = iVar17 + piVar4[1];
        iVar18 = iVar18 + piVar4[2];
        iVar19 = iVar19 + piVar4[3];
        lVar7 = lVar12;
      }
      iVar8 = iVar8 + iVar16;
      iVar13 = iVar13 + iVar17;
      iVar14 = iVar14 + iVar18;
      iVar15 = iVar15 + iVar19;
      if (lVar3 + lVar10 * -8 != 0 && lVar10 * 8 <= lVar3) {
        piVar1 = piVar6 + lVar2;
        iVar8 = iVar8 + *piVar1;
        iVar13 = iVar13 + piVar1[1];
        iVar14 = iVar14 + piVar1[2];
        iVar15 = iVar15 + piVar1[3];
      }
    }
    lVar10 = IVar9 + (lVar11 / 4) * 4;
    iVar8 = iVar15 + iVar13 + iVar14 + iVar8;
    lVar11 = 0;
    if (IVar9 < 1) {
      IVar9 = lVar11;
    }
    for (; IVar9 != lVar11; lVar11 = lVar11 + 1) {
      iVar8 = iVar8 + piVar6[lVar11];
    }
    for (; lVar10 < lVar5; lVar10 = lVar10 + 1) {
      iVar8 = iVar8 + piVar6[lVar10];
    }
  }
  return iVar8;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }